

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall ieee754::round_up(ieee754 *this)

{
  byte bVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  
  uVar4 = this->ebits;
  iVar8 = -1;
  if (7 < (int)uVar4) {
    uVar3 = 0;
    iVar8 = -2;
    bVar6 = 0;
    if (0xf < uVar4) goto LAB_00267ebd;
  }
  uVar3 = iVar8 + this->bytes;
  if (uVar3 != 0 && SCARRY4(iVar8,this->bytes) == (int)uVar3 < 0) {
    uVar5 = 0;
    do {
      puVar2 = this->buf;
      if (puVar2[uVar5] != 0xff) {
        puVar2[uVar5] = puVar2[uVar5] + '\x01';
        return 0;
      }
      puVar2[uVar5] = '\0';
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    uVar4 = this->ebits;
  }
  if ((int)uVar4 < 8) {
    uVar7 = 0x7f;
  }
  else {
    if (0xf < uVar4) {
      bVar6 = 0;
      goto LAB_00267ebd;
    }
    uVar4 = (uint)(byte)((char)uVar4 - 7);
    uVar7 = 0xff;
  }
  bVar6 = (byte)(uVar7 >> ((byte)uVar4 & 0x1f));
LAB_00267ebd:
  bVar1 = this->buf[(int)uVar3];
  bVar9 = bVar1 + 1 & bVar6;
  this->buf[(int)uVar3] = ~bVar6 & bVar1;
  this->buf[(int)uVar3] = this->buf[(int)uVar3] | bVar9;
  return (int)(bVar9 == 0);
}

Assistant:

int mantissa_msb_index() const
    {
        if (ebits <= 7)
            return bytes - 1;
        else if (ebits <= 15)
            return bytes - 2;
        else
        {
            assert(FALSE);
            return 0;
        }
    }